

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MolecularRestraint.hpp
# Opt level: O0

void __thiscall
OpenMD::MolecularRestraint::setReferenceStructure
          (MolecularRestraint *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *ref,
          Vector3d *refCom)

{
  bool bVar1;
  Vector<double,_3U> *in_RDX;
  long in_RDI;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_stack_00000038;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_stack_00000040;
  iterator i;
  Vector3<double> *in_stack_ffffffffffffff98;
  Vector<double,_3U> *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffb8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  local_20 [4];
  
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
            (in_stack_00000040,in_stack_00000038);
  Vector3<double>::operator=((Vector3<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
  ;
  __gnu_cxx::
  __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  ::__normal_iterator(local_20);
  local_20[0]._M_current =
       (Vector3<double> *)
       std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::begin
                 ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                  in_stack_ffffffffffffff98);
  while( true ) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::end
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
    ::operator*(local_20);
    OpenMD::operator-(in_RDX,in_stack_ffffffffffffffa0);
    __gnu_cxx::
    __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
    ::operator*(local_20);
    Vector3<double>::operator=((Vector3<double> *)in_RDX,in_stack_ffffffffffffffa0);
    __gnu_cxx::
    __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
    ::operator++(local_20);
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::clear
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x38b510)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             (in_RDI + 0xb8));
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void setReferenceStructure(std::vector<Vector3d> ref, Vector3d refCom) {
      ref_    = ref;
      refCom_ = refCom;

      std::vector<Vector3d>::iterator i;

      for (i = ref_.begin(); i != ref_.end(); ++i) {
        (*i) = (*i) - refCom_;
      }

      forces_.clear();
      forces_.resize(ref_.size());
    }